

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_name.cc
# Opt level: O0

int x509_name_canon(X509_NAME *a)

{
  int iVar1;
  size_t sVar2;
  stack_st_STACK_OF_X509_NAME_ENTRY *_intname;
  X509_NAME_ENTRY *pXVar3;
  ASN1_OBJECT *pAVar4;
  ulong local_58;
  size_t i;
  int local_48;
  int len;
  int ret;
  int set;
  X509_NAME_ENTRY *tmpentry;
  X509_NAME_ENTRY *entry;
  stack_st_X509_NAME_ENTRY *entries;
  stack_st_STACK_OF_X509_NAME_ENTRY *intname;
  uchar *p;
  X509_NAME *a_local;
  
  entry = (X509_NAME_ENTRY *)0x0;
  _ret = (X509_NAME_ENTRY *)0x0;
  len = -1;
  local_48 = 0;
  p = (uchar *)a;
  if (a->canon_enc != (uchar *)0x0) {
    OPENSSL_free(a->canon_enc);
    p[0x18] = '\0';
    p[0x19] = '\0';
    p[0x1a] = '\0';
    p[0x1b] = '\0';
    p[0x1c] = '\0';
    p[0x1d] = '\0';
    p[0x1e] = '\0';
    p[0x1f] = '\0';
  }
  sVar2 = sk_X509_NAME_ENTRY_num(*(stack_st_X509_NAME_ENTRY **)p);
  if (sVar2 == 0) {
    p[0x20] = '\0';
    p[0x21] = '\0';
    p[0x22] = '\0';
    p[0x23] = '\0';
    a_local._4_4_ = 1;
  }
  else {
    _intname = sk_STACK_OF_X509_NAME_ENTRY_new_null();
    if (_intname != (stack_st_STACK_OF_X509_NAME_ENTRY *)0x0) {
      local_58 = 0;
      while( true ) {
        _ret = (X509_NAME_ENTRY *)0x0;
        sVar2 = sk_X509_NAME_ENTRY_num(*(stack_st_X509_NAME_ENTRY **)p);
        if (sVar2 <= local_58) break;
        pXVar3 = sk_X509_NAME_ENTRY_value(*(stack_st_X509_NAME_ENTRY **)p,local_58);
        if (pXVar3->set != len) {
          entry = (X509_NAME_ENTRY *)sk_X509_NAME_ENTRY_new_null();
          if (entry == (X509_NAME_ENTRY *)0x0) goto LAB_00408b94;
          sVar2 = sk_STACK_OF_X509_NAME_ENTRY_push(_intname,(STACK_OF_X509_NAME_ENTRY *)entry);
          if (sVar2 == 0) {
            sk_X509_NAME_ENTRY_free((stack_st_X509_NAME_ENTRY *)entry);
            goto LAB_00408b94;
          }
          len = pXVar3->set;
        }
        _ret = X509_NAME_ENTRY_new();
        if (_ret == (X509_NAME_ENTRY *)0x0) goto LAB_00408b94;
        pAVar4 = OBJ_dup((ASN1_OBJECT *)pXVar3->object);
        _ret->object = pAVar4;
        iVar1 = asn1_string_canon((ASN1_STRING *)_ret->value,pXVar3->value);
        if ((iVar1 == 0) ||
           (sVar2 = sk_X509_NAME_ENTRY_push
                              ((stack_st_X509_NAME_ENTRY *)entry,(X509_NAME_ENTRY *)_ret),
           sVar2 == 0)) goto LAB_00408b94;
        local_58 = local_58 + 1;
      }
      iVar1 = i2d_name_canon(_intname,(uchar **)0x0);
      if (-1 < iVar1) {
        *(int *)(p + 0x20) = iVar1;
        intname = (stack_st_STACK_OF_X509_NAME_ENTRY *)OPENSSL_malloc((long)*(int *)(p + 0x20));
        if (intname != (stack_st_STACK_OF_X509_NAME_ENTRY *)0x0) {
          *(stack_st_STACK_OF_X509_NAME_ENTRY **)(p + 0x18) = intname;
          i2d_name_canon(_intname,(uchar **)&intname);
          local_48 = 1;
        }
      }
    }
LAB_00408b94:
    if (_ret != (X509_NAME_ENTRY *)0x0) {
      X509_NAME_ENTRY_free(_ret);
    }
    if (_intname != (stack_st_STACK_OF_X509_NAME_ENTRY *)0x0) {
      sk_STACK_OF_X509_NAME_ENTRY_pop_free(_intname,local_sk_X509_NAME_ENTRY_pop_free);
    }
    a_local._4_4_ = local_48;
  }
  return a_local._4_4_;
}

Assistant:

static int x509_name_canon(X509_NAME *a) {
  unsigned char *p;
  STACK_OF(STACK_OF_X509_NAME_ENTRY) *intname = NULL;
  STACK_OF(X509_NAME_ENTRY) *entries = NULL;
  X509_NAME_ENTRY *entry, *tmpentry = NULL;
  int set = -1, ret = 0, len;
  size_t i;

  if (a->canon_enc) {
    OPENSSL_free(a->canon_enc);
    a->canon_enc = NULL;
  }
  // Special case: empty X509_NAME => null encoding
  if (sk_X509_NAME_ENTRY_num(a->entries) == 0) {
    a->canon_enclen = 0;
    return 1;
  }
  intname = sk_STACK_OF_X509_NAME_ENTRY_new_null();
  if (!intname) {
    goto err;
  }
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    entry = sk_X509_NAME_ENTRY_value(a->entries, i);
    if (entry->set != set) {
      entries = sk_X509_NAME_ENTRY_new_null();
      if (!entries) {
        goto err;
      }
      if (!sk_STACK_OF_X509_NAME_ENTRY_push(intname, entries)) {
        sk_X509_NAME_ENTRY_free(entries);
        goto err;
      }
      set = entry->set;
    }
    tmpentry = X509_NAME_ENTRY_new();
    if (tmpentry == NULL) {
      goto err;
    }
    tmpentry->object = OBJ_dup(entry->object);
    if (!asn1_string_canon(tmpentry->value, entry->value)) {
      goto err;
    }
    if (!sk_X509_NAME_ENTRY_push(entries, tmpentry)) {
      goto err;
    }
    tmpentry = NULL;
  }

  // Finally generate encoding

  len = i2d_name_canon(intname, NULL);
  if (len < 0) {
    goto err;
  }
  a->canon_enclen = len;

  p = reinterpret_cast<uint8_t *>(OPENSSL_malloc(a->canon_enclen));

  if (!p) {
    goto err;
  }

  a->canon_enc = p;

  i2d_name_canon(intname, &p);

  ret = 1;

err:

  if (tmpentry) {
    X509_NAME_ENTRY_free(tmpentry);
  }
  if (intname) {
    sk_STACK_OF_X509_NAME_ENTRY_pop_free(intname,
                                         local_sk_X509_NAME_ENTRY_pop_free);
  }
  return ret;
}